

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onEnterFunctionDeclarationExpressionAstNode
          (CompilerAstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  pointer psVar1;
  shared_ptr<Token> *var;
  pointer psVar2;
  undefined1 local_38 [8];
  shared_ptr<compiler::EmissionContext> ec;
  
  std::make_shared<compiler::EmissionContext,std::shared_ptr<compiler::EmissionContext>&>
            ((shared_ptr<compiler::EmissionContext> *)local_38);
  psVar1 = (node->parameters).
           super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (node->parameters).
                super__Vector_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    EmissionContext::Declare
              ((EmissionContext *)local_38,
               &((psVar2->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->value);
    EmissionContext::FullyBind
              ((EmissionContext *)local_38,
               ((long)(((vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                         *)local_38)->
                      super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(((vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                        *)local_38)->
                     super__Vector_base<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x28 - 1);
  }
  std::__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ec);
  return;
}

Assistant:

void onEnterFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {
    auto ec = std::make_shared<compiler::EmissionContext>(this->ec);

    for (const auto& var : node->parameters) {
      ec->Declare(var->value);
      // immediately fully bind all parameters as are never half-declared
      ec->FullyBind(ec->variables.size() - 1);
    }

    this->ec = ec;
  }